

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchSolve.cpp
# Opt level: O0

suppWrap *
Bmatch_FindSuppWrap(vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                    *a,suppWrap **b)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type sVar3;
  const_reference ppsVar4;
  int local_2c;
  int m;
  int j;
  int n;
  int i;
  suppWrap **b_local;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *a_local;
  
  j = 0;
  sVar1 = std::
          vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
          ::size(a);
  do {
    if ((int)sVar1 <= j) {
      return (suppWrap *)0x0;
    }
    local_2c = 0;
    pvVar2 = std::
             vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
             ::operator[](a,(long)j);
    sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size(&pvVar2->second);
    for (; local_2c < (int)sVar3; local_2c = local_2c + 1) {
      pvVar2 = std::
               vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
               ::operator[](a,(long)j);
      ppsVar4 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          (&pvVar2->second,(long)local_2c);
      if (*ppsVar4 == *b) {
        pvVar2 = std::
                 vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                 ::operator[](a,(long)j);
        return pvVar2->first;
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

suppWrap * Bmatch_FindSuppWrap( const vector< pair< suppWrap *, vector< suppWrap * > > > & a, suppWrap * & b )
{
	for( int i = 0, n = a.size(); i < n; ++i ) {
		for( int j = 0, m = a[i].second.size(); j < m; ++j ) {
			if( a[i].second[j] == b ) {
				return a[i].first;
			}
		}
	}
	return NULL;
}